

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

Vector<CFGNode_*> *
dxil_spv::CFGStructurizer::isolate_structured_sorted
          (Vector<CFGNode_*> *__return_storage_ptr__,CFGNode *header,CFGNode *merge)

{
  pointer *pppCVar1;
  uint uVar2;
  uint uVar3;
  iterator __position;
  pointer ppCVar4;
  CFGNode *pCVar5;
  CFGNode *pCVar6;
  long lVar7;
  ulong uVar8;
  pointer ppCVar9;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __i;
  __node_base _Var10;
  pointer ppCVar11;
  CFGNode *node;
  UnorderedSet<CFGNode_*> nodes;
  CFGNode *local_60;
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_58;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  isolate_structured((UnorderedSet<CFGNode_*> *)&local_58,header,merge);
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::reserve
            (__return_storage_ptr__,local_58._M_element_count);
  if (local_58._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var10._M_nxt = local_58._M_before_begin._M_nxt;
    do {
      local_60 = (CFGNode *)_Var10._M_nxt[1]._M_nxt;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
        _M_realloc_insert<dxil_spv::CFGNode*const&>
                  ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                   __return_storage_ptr__,__position,&local_60);
      }
      else {
        *__position._M_current = local_60;
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
    } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
  }
  ppCVar9 = (__return_storage_ptr__->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (__return_storage_ptr__->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar9 != ppCVar4) {
    uVar8 = (long)ppCVar4 - (long)ppCVar9 >> 3;
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::isolate_structured_sorted(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)::__0>>
              (ppCVar9,ppCVar4,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppCVar4 - (long)ppCVar9 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::isolate_structured_sorted(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)::__0>>
                (ppCVar9,ppCVar4);
    }
    else {
      ppCVar11 = ppCVar9 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::isolate_structured_sorted(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)::__0>>
                (ppCVar9,ppCVar11);
      for (; ppCVar11 != ppCVar4; ppCVar11 = ppCVar11 + 1) {
        pCVar5 = ppCVar11[-1];
        pCVar6 = *ppCVar11;
        uVar3 = pCVar6->forward_post_visit_order;
        uVar2 = pCVar5->forward_post_visit_order;
        ppCVar9 = ppCVar11;
        while (uVar2 < uVar3) {
          *ppCVar9 = pCVar5;
          pCVar5 = ppCVar9[-2];
          ppCVar9 = ppCVar9 + -1;
          uVar2 = pCVar5->forward_post_visit_order;
        }
        *ppCVar9 = pCVar6;
      }
    }
  }
  std::
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Vector<CFGNode *> CFGStructurizer::isolate_structured_sorted(const CFGNode *header, const CFGNode *merge)
{
	UnorderedSet<CFGNode *> nodes;
	isolate_structured(nodes, header, merge);

	Vector<CFGNode *> sorted;
	sorted.reserve(nodes.size());

	for (auto *node : nodes)
		sorted.push_back(node);

	std::sort(sorted.begin(), sorted.end(),
	          [](const CFGNode *a, const CFGNode *b) { return a->forward_post_visit_order > b->forward_post_visit_order; });
	return sorted;
}